

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

void __thiscall hdc::PrettyPrinter::visit(PrettyPrinter *this,ElseStatement *statement)

{
  CompoundStatement *pCVar1;
  ElseStatement *statement_local;
  PrettyPrinter *this_local;
  
  std::operator<<((ostream *)&this->field_0x20,"\n");
  print_indentation(this);
  std::operator<<((ostream *)&this->field_0x20,"else:\n");
  indent(this);
  pCVar1 = ElseStatement::getStatements(statement);
  (**(pCVar1->super_Statement).super_ASTNode._vptr_ASTNode)(pCVar1,this);
  dedent(this);
  return;
}

Assistant:

void PrettyPrinter::visit(ElseStatement* statement) {
    output << "\n";
    print_indentation();
    output << "else:\n";
    indent();
    statement->getStatements()->accept(this);
    dedent();
}